

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::updateGeometry(XFormWidget *this)

{
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *this_00;
  double dVar1;
  double dVar2;
  HalfedgeElement *pHVar3;
  pointer pVVar4;
  Joint *this_01;
  long lVar5;
  SceneObject *pSVar6;
  double *pdVar7;
  BBox *pBVar8;
  byte bVar9;
  double local_68;
  double dStack_60;
  double local_58;
  
  bVar9 = 0;
  if ((this->target).object == (SceneObject *)0x0) {
    return;
  }
  this_00 = &this->axes;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(this_00,3);
  if (this->objectMode != true) {
    pHVar3 = (this->target).element;
    if (pHVar3 == (HalfedgeElement *)0x0) {
      return;
    }
    if (this->transformedMode == true) {
      (**pHVar3->_vptr_HalfedgeElement)(&local_68);
      pSVar6 = (this->target).object;
      dVar1 = (pSVar6->position).y;
      dVar2 = (pSVar6->position).z;
      (this->center).x = local_68 + (pSVar6->position).x;
      (this->center).y = dStack_60 + dVar1;
      (this->center).z = local_58 + dVar2;
    }
    else {
      (**pHVar3->_vptr_HalfedgeElement)(&local_68);
      (this->center).z = local_58;
      (this->center).x = local_68;
      (this->center).y = dStack_60;
    }
    (*((this->target).element)->_vptr_HalfedgeElement[1])(&local_68);
    pdVar7 = &local_68;
    pBVar8 = &this->bounds;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pBVar8->max).x = *pdVar7;
      pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
      pBVar8 = (BBox *)((long)pBVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    pHVar3 = (this->target).element;
    (*pHVar3->_vptr_HalfedgeElement[2])(pHVar3,this_00);
    return;
  }
  pSVar6 = (this->target).object;
  if (pSVar6 == (SceneObject *)0x0) {
    this_01 = (Joint *)0x0;
  }
  else {
    this_01 = (Joint *)__dynamic_cast(pSVar6,&SceneObject::typeinfo,&Joint::typeinfo,0);
  }
  if (this_01 == (Joint *)0x0) {
    (this->center).z = (pSVar6->position).z;
    local_68 = (pSVar6->position).x;
    dStack_60 = (pSVar6->position).y;
  }
  else {
    Joint::getBasePosInWorld(this_01);
    (this->center).z = local_58;
  }
  (this->center).x = local_68;
  (this->center).y = dStack_60;
  if ((this->jointMode == true) && (this->jointIsRoot == true)) {
    pSVar6 = (this->target).object;
    if (pSVar6 == (SceneObject *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(pSVar6,&SceneObject::typeinfo,&Joint::typeinfo,0);
    }
    if (lVar5 == 0) goto LAB_001737b5;
    pSVar6 = *(SceneObject **)(*(long *)(lVar5 + 0x140) + 0xf0);
  }
  else {
    pSVar6 = (this->target).object;
  }
  (*pSVar6->_vptr_SceneObject[4])(&local_68);
  pdVar7 = &local_68;
  pBVar8 = &this->bounds;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pBVar8->max).x = *pdVar7;
    pdVar7 = pdVar7 + (ulong)bVar9 * -2 + 1;
    pBVar8 = (BBox *)((long)pBVar8 + (ulong)bVar9 * -0x10 + 8);
  }
LAB_001737b5:
  if (this_01 == (Joint *)0x0) {
    pVVar4 = (this_00->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4->x = 1.0;
    pVVar4->y = 0.0;
    pVVar4->z = 0.0;
    pVVar4[1].x = 0.0;
    pVVar4[1].y = 1.0;
    pVVar4[1].z = 0.0;
    pVVar4[2].x = 0.0;
    pVVar4[2].y = 0.0;
    pVVar4[2].z = 1.0;
  }
  else {
    Joint::getAxes(this_01,this_00);
  }
  return;
}

Assistant:

void XFormWidget::updateGeometry()
{
  if (target.object == nullptr) return;

   axes.resize(3);
   if (objectMode) {
     Joint* joint = dynamic_cast<Joint*>(target.object);
     if (joint != nullptr)
       center = joint->getBasePosInWorld();
     else
       center = target.object->position;
     if (jointMode && jointIsRoot)
     {
        Joint* j = dynamic_cast<Joint*>(target.object);
        if (j != nullptr)
           bounds = j->skeleton->mesh->get_bbox();
     }
     else
       bounds = target.object->get_bbox();
     if (joint != nullptr)
     {
       joint->getAxes(axes);
     }
     else
     {
       axes[0] = Vector3D(1., 0., 0.);
       axes[1] = Vector3D(0., 1., 0.);
       axes[2] = Vector3D(0., 0., 1.);
     }
   } else {
     if (target.element == nullptr) return;
     if (transformedMode) {
       center = target.element->centroid() + target.object->position;
     }
     else {
       center = target.element->centroid();
     }
     bounds = target.element->bounds();
     target.element->getAxes( axes );
   }
}